

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O1

void * hash_table_get(HashTable *hash_table,char *key)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  undefined4 extraout_var;
  HashTableEntry *pHVar5;
  void *pvVar4;
  
  uVar3 = hash(hash_table->size,key);
  pHVar5 = hash_table->table[uVar3];
  if (pHVar5 != (HashTableEntry *)0x0) {
    do {
      iVar2 = strcmp(key,pHVar5->key);
      pvVar4 = (void *)CONCAT44(extraout_var,iVar2);
      if (iVar2 < 1) {
        if (iVar2 == 0) {
          pvVar4 = pHVar5->literal;
          bVar1 = false;
          goto LAB_00104230;
        }
        break;
      }
      pHVar5 = pHVar5->next;
    } while (pHVar5 != (HashTableEntry *)0x0);
    bVar1 = true;
LAB_00104230:
    if (!bVar1) {
      return pvVar4;
    }
  }
  return (void *)0x0;
}

Assistant:

void *hash_table_get(HashTable *hash_table, char *key) {
  unsigned long int hash_literal = hash(hash_table->size, key);

  HashTableEntry *next = hash_table->table[hash_literal];

  if (next != NULL) {
    HashTableEntry *last;

    while (next != NULL && strcmp(key, next->key) > 0) {
      last = next;
      next = last->next;
    }

    if (next != NULL && strcmp(key, next->key) == 0) {
      return next->literal;
    }
  }

  return NULL;
}